

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void units::multiplyRep(string *unit_string,size_t loc,size_t sz)

{
  byte bVar1;
  byte bVar2;
  pointer pcVar3;
  uint uVar4;
  
  if (loc == 0) {
    loc = 0;
  }
  else {
    if (unit_string->_M_string_length <= sz + loc) {
      std::__cxx11::string::erase((ulong)unit_string,loc);
      uVar4 = (byte)(unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] - 0x2a;
      if ((uVar4 < 0x35) && ((0x10000000000021U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        std::__cxx11::string::pop_back();
        return;
      }
      return;
    }
    pcVar3 = (unit_string->_M_dataplus)._M_p;
    bVar1 = pcVar3[loc - 1];
    bVar2 = pcVar3[sz + loc];
    if (((((bVar1 != 0x5e) && (bVar1 != 0x2a)) && (bVar1 != 0x2f)) &&
        ((bVar2 != 0x5e && (bVar2 != 0x2a)))) && (bVar2 != 0x2f)) {
      std::__cxx11::string::replace((ulong)unit_string,loc,(char *)sz,0x18c3e6);
      return;
    }
    uVar4 = bVar1 - 0x2a;
    if (((uVar4 < 0x35) && ((0x10000000000021U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) &&
       ((bVar2 - 0x2a < 0x35 && ((0x10000000000021U >> ((ulong)(bVar2 - 0x2a) & 0x3f) & 1) != 0))))
    {
      loc = loc - 1;
    }
  }
  std::__cxx11::string::erase((ulong)unit_string,loc);
  return;
}

Assistant:

static void multiplyRep(std::string& unit_string, size_t loc, size_t sz)
{
    if (loc == 0) {
        unit_string.erase(0, sz);
        return;
    }
    if (unit_string.size() <= loc + sz) {
        unit_string.erase(loc, sz);
        if (unit_string.back() == '^' || unit_string.back() == '*' ||
            unit_string.back() == '/') {
            unit_string.pop_back();
        }
        return;
    }
    auto tchar = unit_string[loc - 1];
    auto tchar2 = unit_string[loc + sz];
    if (tchar == '*' || tchar == '/' || tchar == '^' || tchar2 == '*' ||
        tchar2 == '/' || tchar2 == '^') {
        if ((tchar == '*' || tchar == '/' || tchar == '^') &&
            (tchar2 == '*' || tchar2 == '/' || tchar2 == '^')) {
            unit_string.erase(loc - 1, sz + 1);
        } else {
            unit_string.erase(loc, sz);
        }
    } else {
        unit_string.replace(loc, sz, "*");
    }
}